

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_taylor.cpp
# Opt level: O2

taylor<double,_2,_10> * binomial_generating_function<double,10>(void)

{
  double *pdVar1;
  int iVar2;
  taylor<double,_2,_10> *in_RDI;
  int i;
  int i_00;
  bool bVar3;
  double dVar4;
  taylor<double,_1,_10> local_ad8;
  taylor<double,_2,_10> tmp_2;
  taylor<double,_2,_10> y;
  taylor<double,_2,_10> tmp;
  taylor<double,_2,_10> tmp_1;
  taylor<double,_2,_10> x;
  
  y.super_polynomial<double,_2,_10>.c[0]._0_4_ = 0;
  taylor<double,_2,_10>::taylor<int>(&x,(int *)&y,0);
  tmp_2.super_polynomial<double,_2,_10>.c[0] =
       (double)((ulong)tmp_2.super_polynomial<double,_2,_10>.c[0]._4_4_ << 0x20);
  i_00 = 1;
  taylor<double,_2,_10>::taylor<int>(&y,(int *)&tmp_2,1);
  memcpy(&tmp,&x,0x210);
  tmp.super_polynomial<double,_2,_10>.c[0] = tmp.super_polynomial<double,_2,_10>.c[0] + 1.0;
  memset(&tmp_1,0,0x210);
  polymul_internal::taylor_multiplier<double,_2,_10,_10>::mul_set
            ((double *)&tmp_1,(double *)&tmp,(double *)&y);
  taylor<double,_2,_10>::operator-(&tmp_2,&tmp_1);
  tmp_2.super_polynomial<double,_2,_10>.c[0] = tmp_2.super_polynomial<double,_2,_10>.c[0] + 1.0;
  local_ad8.super_polynomial<double,_1,_10>.c[9] = 0.0;
  local_ad8.super_polynomial<double,_1,_10>.c[10] = 0.0;
  local_ad8.super_polynomial<double,_1,_10>.c[7] = 0.0;
  local_ad8.super_polynomial<double,_1,_10>.c[8] = 0.0;
  local_ad8.super_polynomial<double,_1,_10>.c[5] = 0.0;
  local_ad8.super_polynomial<double,_1,_10>.c[6] = 0.0;
  local_ad8.super_polynomial<double,_1,_10>.c[3] = 0.0;
  local_ad8.super_polynomial<double,_1,_10>.c[4] = 0.0;
  local_ad8.super_polynomial<double,_1,_10>.c[1] = 0.0;
  local_ad8.super_polynomial<double,_1,_10>.c[2] = 0.0;
  if ((tmp_2.super_polynomial<double,_2,_10>.c[0] == 0.0) &&
     (!NAN(tmp_2.super_polynomial<double,_2,_10>.c[0]))) {
    __assert_fail("a != 0 && \"1/(a+x) not analytic at a = 0\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/uekstrom[P]libtaylor/taylor_math.hpp"
                  ,0x24,"void inv_taylor(taylor<T, 1, N> &, const T &) [T = double, N = 10]");
  }
  local_ad8.super_polynomial<double,_1,_10>.c[0] = 1.0 / tmp_2.super_polynomial<double,_2,_10>.c[0];
  iVar2 = 10;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    pdVar1 = taylor<double,_1,_10>::operator[](&local_ad8,i_00 + -1);
    dVar4 = -*pdVar1 * local_ad8.super_polynomial<double,_1,_10>.c[0];
    pdVar1 = taylor<double,_1,_10>::operator[](&local_ad8,i_00);
    *pdVar1 = dVar4;
    i_00 = i_00 + 1;
  }
  taylor<double,_1,_10>::operator*=(&local_ad8,1);
  memset(in_RDI,0,0x210);
  taylor<double,_2,_10>::compose<10>(&tmp_2,in_RDI,&local_ad8);
  return in_RDI;
}

Assistant:

taylor<T, 2, N> binomial_generating_function() {
  taylor<T, 2, N> x(0, 0), y(0, 1);
  return 1 / (1 - (1 + x) * y); // generating function for the binomial coefficients
}